

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjpeg.c
# Opt level: O2

opj_bool opj_setup_decoder_v2
                   (opj_codec_t *p_info,opj_dparameters_t *parameters,opj_event_mgr_t *event_mgr)

{
  char *__ptr;
  size_t sStack_20;
  
  if (((p_info == (opj_codec_t *)0x0) || (parameters == (opj_dparameters_t *)0x0)) ||
     (event_mgr == (opj_event_mgr_t *)0x0)) {
    __ptr = "[ERROR] Input parameters of the setup_decoder function are incorrect.\n";
    sStack_20 = 0x46;
  }
  else {
    if ((event_mgr->error_handler != (opj_msg_callback)0x0) &&
       (event_mgr->warning_handler != (opj_msg_callback)0x0)) {
      if (*(int *)(p_info + 0xc) != 0) {
        (*(code *)p_info[6])(p_info[10]);
        p_info[0xb] = event_mgr;
        return 1;
      }
      opj_event_msg_v2(event_mgr,1,
                       "Codec provided to the setup_decoder function is not a decompressor handler.\n"
                      );
      return 0;
    }
    __ptr = "[ERROR] Event handler provided to the setup_decoder function is not valid.\n";
    sStack_20 = 0x4b;
  }
  fwrite(__ptr,sStack_20,1,_stderr);
  return 0;
}

Assistant:

opj_bool OPJ_CALLCONV opj_setup_decoder_v2(opj_codec_t *p_info, opj_dparameters_t *parameters, opj_event_mgr_t* event_mgr)
{
	opj_codec_private_t * l_info = (opj_codec_private_t *) p_info;

	if ( !p_info || !parameters || !event_mgr ){
		fprintf(stderr, "[ERROR] Input parameters of the setup_decoder function are incorrect.\n");
		return OPJ_FALSE;
	}

	if ( !event_mgr->error_handler || !event_mgr->warning_handler || !event_mgr->error_handler){
		fprintf(stderr, "[ERROR] Event handler provided to the setup_decoder function is not valid.\n");
		return OPJ_FALSE;
	}

	if (! l_info->is_decompressor) {
		opj_event_msg_v2(event_mgr, EVT_ERROR, "Codec provided to the setup_decoder function is not a decompressor handler.\n");
		return OPJ_FALSE;
	}

	l_info->m_codec_data.m_decompression.opj_setup_decoder(l_info->m_codec, parameters);

	l_info->m_event_mgr = event_mgr;

	return OPJ_TRUE;
}